

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<int_*const_&,_int_*const_&> * __thiscall
Catch::ExprLhs<int*const&>::operator==
          (BinaryExpr<int_*const_&,_int_*const_&> *__return_storage_ptr__,ExprLhs<int*const&> *this,
          int **rhs)

{
  int **lhs;
  bool comparisonResult;
  StringRef local_30;
  int **local_20;
  int **rhs_local;
  ExprLhs<int_*const_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (int **)this;
  this_local = (ExprLhs<int_*const_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<int*,int*>(*(int ***)this,rhs);
  lhs = *(int ***)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<int_*const_&,_int_*const_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }